

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O2

void __thiscall
QtMWidgets::DateTimePickerPrivate::normalizeOffset(DateTimePickerPrivate *this,int section)

{
  QVector<Section> *this_00;
  int iVar1;
  int iVar2;
  reference pSVar3;
  int iVar4;
  Section *pSVar5;
  int iVar6;
  long i;
  
  this_00 = &(this->super_DateTimeParser).sections;
  i = (long)section;
  pSVar5 = (this->super_DateTimeParser).sections.d.ptr;
  iVar2 = this->itemTopMargin + this->itemHeight;
  iVar1 = (int)pSVar5[i].values.d.size;
  do {
    iVar6 = pSVar5[i].offset;
    iVar4 = -iVar6;
    if (0 < iVar6) {
      iVar4 = iVar6;
    }
    if (iVar4 <= iVar2 / 2) {
      return;
    }
    if (iVar6 < 1) {
      if (iVar1 < this->itemsMaxCount) {
        pSVar3 = QList<QtMWidgets::Section>::operator[](this_00,i);
        iVar6 = pSVar3->currentIndex;
        pSVar3 = QList<QtMWidgets::Section>::operator[](this_00,i);
        if ((pSVar3->values).d.size + -1 == (long)iVar6) goto LAB_0016b623;
      }
      pSVar3 = QList<QtMWidgets::Section>::operator[](this_00,i);
      pSVar3->offset = pSVar3->offset + iVar2;
      iVar4 = (this->super_DateTimeParser).sections.d.ptr[i].currentIndex;
      iVar6 = iVar4 + 1;
      if (iVar1 + -1 == iVar4) {
        iVar6 = 0;
      }
    }
    else {
      if ((iVar1 < this->itemsMaxCount) &&
         (pSVar3 = QList<QtMWidgets::Section>::operator[](this_00,i), pSVar3->currentIndex == 0)) {
LAB_0016b623:
        pSVar3 = QList<QtMWidgets::Section>::operator[](this_00,i);
        pSVar3->offset = 0;
        return;
      }
      pSVar3 = QList<QtMWidgets::Section>::operator[](this_00,i);
      pSVar3->offset = pSVar3->offset - iVar2;
      iVar6 = (this->super_DateTimeParser).sections.d.ptr[i].currentIndex;
      if (iVar6 == 0) {
        iVar6 = iVar1;
      }
      iVar6 = iVar6 + -1;
    }
    pSVar3 = QList<QtMWidgets::Section>::operator[](this_00,i);
    pSVar3->currentIndex = iVar6;
    pSVar5 = (this->super_DateTimeParser).sections.d.ptr;
  } while( true );
}

Assistant:

void
DateTimePickerPrivate::normalizeOffset( int section )
{
	const int sectionValuesSize = sections.at( section ).values.size();
	const int totalItemHeight = itemHeight + itemTopMargin;

	while( qAbs( sections.at( section ).offset ) > totalItemHeight / 2 )
	{
		if( sections.at( section ).offset > 0 )
		{
			if( sectionValuesSize < itemsMaxCount &&
				sections[ section ].currentIndex == 0 )
			{
				sections[ section ].offset = 0;
				break;
			}

			sections[ section ].offset -= totalItemHeight;
			sections[ section ].currentIndex = prevIndex(
				sections.at( section ).currentIndex, sectionValuesSize );
		}
		else
		{
			if( sectionValuesSize < itemsMaxCount &&
				sections[ section ].currentIndex ==
					sections[ section ].values.size() - 1 )
			{
				sections[ section ].offset = 0;
				break;
			}

			sections[ section ].offset += totalItemHeight;
			sections[ section ].currentIndex = nextIndex(
				sections.at( section ).currentIndex, sectionValuesSize );
		}
	}
}